

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c92d48::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  if (total <= 0.0) {
    return false;
  }
  lVar1 = this->CurrentPercentage;
  lVar2 = lround((value / total) * 100.0);
  lVar3 = 100;
  if (lVar2 < 100) {
    lVar3 = lVar2;
  }
  this->CurrentPercentage = lVar3;
  bVar4 = lVar1 != lVar3;
  if (bVar4) {
    local_48.View_._M_len = 1;
    local_48.View_._M_str = "[";
    local_78.View_._M_str = (this->Text)._M_dataplus._M_p;
    local_78.View_._M_len = (this->Text)._M_string_length;
    cmStrCat<char[2],long,char[12]>
              (&sStack_98,&local_48,&local_78,(char (*) [2])0x641196,&this->CurrentPercentage,
               (char (*) [12])"% complete]");
    std::__cxx11::string::operator=((string *)status,(string *)&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  return bVar4;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }